

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType1Interpreter.cpp
# Opt level: O0

EStatusCode __thiscall
CharStringType1Interpreter::InterpretNumber
          (CharStringType1Interpreter *this,Byte inBuffer,
          InputCharStringDecodeStream *inCharStringToIntepret)

{
  int iVar1;
  EStatusCode EVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  byte local_36;
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  Byte byte4;
  Byte byte3;
  Byte byte2;
  Byte byte1_2;
  Byte byte1_1;
  long lStack_30;
  Byte byte1;
  long operand;
  InputCharStringDecodeStream *inCharStringToIntepret_local;
  CharStringType1Interpreter *pCStack_18;
  Byte inBuffer_local;
  CharStringType1Interpreter *this_local;
  
  operand = (long)inCharStringToIntepret;
  inCharStringToIntepret_local._7_1_ = inBuffer;
  pCStack_18 = this;
  if ((inBuffer < 0x20) || (0xf6 < inBuffer)) {
    if ((inBuffer < 0xf7) || (0xfa < inBuffer)) {
      if ((inBuffer < 0xfb) || (0xfe < inBuffer)) {
        if (inBuffer != 0xff) {
          return eFailure;
        }
        iVar1 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                          (inCharStringToIntepret,&local_33,1);
        if (CONCAT44(extraout_var_01,iVar1) != 1) {
          return eFailure;
        }
        lVar3 = (**(code **)(*(long *)operand + 0x10))(operand,&local_34,1);
        if (lVar3 != 1) {
          return eFailure;
        }
        lVar3 = (**(code **)(*(long *)operand + 0x10))(operand,&local_35,1);
        if (lVar3 != 1) {
          return eFailure;
        }
        lVar3 = (**(code **)(*(long *)operand + 0x10))(operand,&local_36,1);
        if (lVar3 != 1) {
          return eFailure;
        }
        iVar1 = (uint)local_33 * 0x1000000 + (uint)local_34 * 0x10000 + (uint)local_35 * 0x100 +
                (uint)local_36;
      }
      else {
        iVar1 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                          (inCharStringToIntepret,&local_32,1);
        if (CONCAT44(extraout_var_00,iVar1) != 1) {
          return eFailure;
        }
        iVar1 = ((short)(inCharStringToIntepret_local._7_1_ - 0xfb) * -0x100 - (uint)local_32) +
                -0x6c;
      }
    }
    else {
      iVar1 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                        (inCharStringToIntepret,&local_31,1);
      if (CONCAT44(extraout_var,iVar1) != 1) {
        return eFailure;
      }
      iVar1 = (inCharStringToIntepret_local._7_1_ - 0xf7) * 0x100 + (uint)local_31 + 0x6c;
    }
  }
  else {
    iVar1 = (short)(ushort)inBuffer + -0x8b;
  }
  lStack_30 = (long)iVar1;
  std::__cxx11::list<long,_std::allocator<long>_>::push_back
            (&this->mOperandStack,&stack0xffffffffffffffd0);
  EVar2 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0x1a])
                    (this->mImplementationHelper,lStack_30);
  return EVar2;
}

Assistant:

EStatusCode CharStringType1Interpreter::InterpretNumber(Byte inBuffer,InputCharStringDecodeStream* inCharStringToIntepret)
{
	long operand;

	if(32 <= inBuffer && inBuffer <= 246)
	{
		operand = (short)inBuffer - 139;
	}
	else if(247 <= inBuffer && inBuffer <= 250)
	{
		Byte byte1;
		if(inCharStringToIntepret->Read(&byte1,1) != 1)
			return eFailure;

		operand = (inBuffer - 247) * 256 + byte1 + 108;
	}
	else if(251 <= inBuffer && inBuffer <= 254)
	{
		Byte byte1;
		if(inCharStringToIntepret->Read(&byte1,1) != 1)
			return eFailure;

		operand = -(short)(inBuffer - 251) * 256 - byte1 - 108;
	}
	else if(255 == inBuffer)
	{
		Byte byte1,byte2,byte3,byte4;
		
		if(inCharStringToIntepret->Read(&byte1,1) != 1)
			return eFailure;
		if(inCharStringToIntepret->Read(&byte2,1) != 1)
			return eFailure;
		if(inCharStringToIntepret->Read(&byte3,1) != 1)
			return eFailure;
		if(inCharStringToIntepret->Read(&byte4,1) != 1)
			return eFailure;


		operand = (int)(
						((unsigned long)(byte1) << 24) + 
						((unsigned long)(byte2) << 16) + 
						((unsigned long)(byte3) << 8) + 
						(byte4));
	}
	else
		return eFailure;

	mOperandStack.push_back(operand);
	return mImplementationHelper->Type1InterpretNumber(operand);
}